

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::SmallVector<unsigned_int,_5UL>::push_back(SmallVector<unsigned_int,_5UL> *this,uint *x)

{
  value_type_conflict2 vVar1;
  size_type __n;
  reference pvVar2;
  uint *x_local;
  SmallVector<unsigned_int,_5UL> *this_local;
  
  if (this->usedFixed < 5) {
    vVar1 = *x;
    __n = this->usedFixed;
    this->usedFixed = __n + 1;
    pvVar2 = std::array<unsigned_int,_5UL>::operator[](&this->fixed,__n);
    *pvVar2 = vVar1;
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->flexible,x);
  }
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }